

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_Serial.cpp
# Opt level: O1

bool __thiscall axl::io::Serial::getSettings(Serial *this,SerialSettings *settings)

{
  int iVar1;
  termios attr;
  termios local_4c;
  
  iVar1 = tcgetattr((this->m_serial).super_File.
                    super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h,
                    &local_4c);
  if (iVar1 == -1) {
    err::setLastSystemError();
  }
  else {
    SerialSettings::setAttr(settings,(termios *)&local_4c);
  }
  return iVar1 != -1;
}

Assistant:

bool
Serial::getSettings(SerialSettings* settings) {
	termios attr;
	bool result = m_serial.getAttr(&attr);
	if (!result)
		return false;

	settings->setAttr(&attr);
	return true;
}